

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboTestUtil.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::FboTestUtil::TextureCubeArrayShader::setUniforms
          (TextureCubeArrayShader *this,Context *gl,deUint32 program)

{
  uint uVar1;
  Mat3 *pMVar2;
  undefined1 *puVar3;
  long lVar4;
  int col;
  long lVar5;
  Array<float,_9> a;
  undefined1 local_44 [36];
  
  (*gl->_vptr_Context[0x76])(gl,(ulong)program);
  uVar1 = (*gl->_vptr_Context[0x66])(gl,(ulong)program,"u_sampler0");
  lVar5 = 0;
  (*gl->_vptr_Context[0x5b])(gl,(ulong)uVar1,0);
  uVar1 = (*gl->_vptr_Context[0x66])(gl,(ulong)program,"u_coordMat");
  pMVar2 = &this->m_coordMat;
  puVar3 = local_44;
  do {
    lVar4 = 0;
    do {
      *(undefined4 *)(puVar3 + lVar4) =
           *(undefined4 *)((long)(pMVar2->m_data).m_data[0].m_data + lVar4);
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0xc);
    lVar5 = lVar5 + 1;
    pMVar2 = (Mat3 *)((pMVar2->m_data).m_data + 1);
    puVar3 = puVar3 + 0xc;
  } while (lVar5 != 3);
  (*gl->_vptr_Context[100])(gl,(ulong)uVar1,1,0,local_44);
  uVar1 = (*gl->_vptr_Context[0x66])(gl,(ulong)program,"u_layer");
  (*gl->_vptr_Context[0x5b])(gl,(ulong)uVar1,(ulong)(uint)this->m_layer);
  uVar1 = (*gl->_vptr_Context[0x66])(gl,(ulong)program,"u_scale");
  (*gl->_vptr_Context[0x5f])(gl,(ulong)uVar1,1,&(this->super_ShaderProgram).field_0x154);
  uVar1 = (*gl->_vptr_Context[0x66])(gl,(ulong)program,"u_bias");
  (*gl->_vptr_Context[0x5f])(gl,(ulong)uVar1,1,&this->m_texBias);
  return;
}

Assistant:

void TextureCubeArrayShader::setUniforms (sglr::Context& gl, deUint32 program) const
{
	gl.useProgram(program);

	gl.uniform1i(gl.getUniformLocation(program, "u_sampler0"), 0);
	gl.uniformMatrix3fv(gl.getUniformLocation(program, "u_coordMat"), 1, GL_FALSE, m_coordMat.getColumnMajorData().getPtr());
	gl.uniform1i(gl.getUniformLocation(program, "u_layer"), m_layer);
	gl.uniform4fv(gl.getUniformLocation(program, "u_scale"), 1, m_texScale.getPtr());
	gl.uniform4fv(gl.getUniformLocation(program, "u_bias"), 1, m_texBias.getPtr());
}